

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

unique_ptr<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>_>
 MCTS::compute_tree<KalahaState<(short)6>>
           (KalahaState<(short)6> root_state,ComputeOptions options,result_type initial_seed)

{
  undefined1 uVar1;
  bool bVar2;
  runtime_error *this;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *this_00;
  _Head_base<0UL,_MCTS::Node<KalahaState<(short)6>_>_*,_false> in_RDI;
  Move move;
  pointer node;
  int iter;
  KalahaState<(short)6> state;
  mt19937_64 random_engine;
  unique_ptr<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>_>
  *root;
  pointer in_stack_fffffffffffff578;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff580;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff5a0;
  undefined1 in_stack_fffffffffffff5a4;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 *__src;
  KalahaState<(short)6> *this_01;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmVar5;
  undefined4 in_stack_fffffffffffff5e8;
  int iVar6;
  Node<KalahaState<(short)6>_> *in_stack_fffffffffffff5f0;
  int in_stack_fffffffffffff7d4;
  char *in_stack_fffffffffffff7d8;
  char *in_stack_fffffffffffff7e0;
  
  this_01 = (KalahaState<(short)6> *)&stack0x00000030;
  __src = &stack0x00000008;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(in_stack_fffffffffffff580,(result_type)in_stack_fffffffffffff578);
  if ((this_01->player_to_move < 0) && (*(double *)this_01->player1_bins < 0.0)) {
    assertion_failed(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
  }
  if (0.0 <= *(double *)this_01->player1_bins) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(int *)(__src + 4) != 1) && (*(int *)(__src + 4) != 2)) {
    assertion_failed(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
  }
  operator_new(0x60);
  Node<KalahaState<(short)6>_>::Node
            ((Node<KalahaState<(short)6>_> *)in_stack_fffffffffffff580,
             (KalahaState<(short)6> *)in_stack_fffffffffffff578);
  std::
  unique_ptr<MCTS::Node<KalahaState<(short)6>>,std::default_delete<MCTS::Node<KalahaState<(short)6>>>>
  ::unique_ptr<std::default_delete<MCTS::Node<KalahaState<(short)6>>>,void>
            ((unique_ptr<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>_>
              *)in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  KalahaState<(short)6>::KalahaState((KalahaState<(short)6> *)&stack0xfffffffffffff5f0,3);
  iVar6 = 1;
  while( true ) {
    uVar4 = true;
    if (this_01->player_to_move < iVar6) {
      uVar4 = this_01->player_to_move < 0;
    }
    if ((bool)uVar4 == false) break;
    this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
               *)std::
                 unique_ptr<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>_>
                 ::get((unique_ptr<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>_>
                        *)in_stack_fffffffffffff580);
    memcpy(&stack0xfffffffffffff5f0,__src,0x26);
    while( true ) {
      uVar1 = Node<KalahaState<(short)6>_>::has_untried_moves
                        ((Node<KalahaState<(short)6>_> *)0x12d357);
      uVar3 = false;
      if (!(bool)uVar1) {
        in_stack_fffffffffffff5a4 =
             Node<KalahaState<(short)6>_>::has_children((Node<KalahaState<(short)6>_> *)0x12d378);
        uVar3 = in_stack_fffffffffffff5a4;
      }
      if ((bool)uVar3 == false) break;
      in_stack_fffffffffffff598 =
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)Node<KalahaState<(short)6>_>::select_child_UCT(in_RDI._M_head_impl);
      this_00 = in_stack_fffffffffffff598;
      KalahaState<(short)6>::do_move(this_01,(Move)((ulong)__src >> 0x30));
    }
    bVar2 = Node<KalahaState<(short)6>_>::has_untried_moves
                      ((Node<KalahaState<(short)6>_> *)0x12d413);
    if (bVar2) {
      Node<KalahaState<(short)6>>::
      get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                ((Node<KalahaState<(short)6>_> *)
                 CONCAT17(uVar4,CONCAT16(uVar1,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff5a4,
                                                                       in_stack_fffffffffffff5a0))))
                 ,in_stack_fffffffffffff598);
      KalahaState<(short)6>::do_move(this_01,(Move)((ulong)__src >> 0x30));
      this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                 *)Node<KalahaState<(short)6>_>::add_child
                             (in_stack_fffffffffffff5f0,
                              (Move *)CONCAT44(iVar6,in_stack_fffffffffffff5e8),
                              (KalahaState<(short)6> *)this_00);
    }
    while (bVar2 = KalahaState<(short)6>::has_moves
                             ((KalahaState<(short)6> *)&stack0xfffffffffffff5f0), bVar2) {
      KalahaState<(short)6>::
      do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                ((KalahaState<(short)6> *)
                 CONCAT17(uVar4,CONCAT16(uVar1,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff5a4,
                                                                       in_stack_fffffffffffff5a0))))
                 ,in_stack_fffffffffffff598);
    }
    while (this_00 !=
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)0x0) {
      pmVar5 = this_00;
      in_stack_fffffffffffff580 =
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)KalahaState<(short)6>::get_result
                        ((KalahaState<(short)6> *)CONCAT44(iVar6,in_stack_fffffffffffff5e8),
                         (int)((ulong)this_00 >> 0x20));
      Node<KalahaState<(short)6>_>::update
                ((Node<KalahaState<(short)6>_> *)this_00,(double)in_stack_fffffffffffff580);
      this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                 *)pmVar5->_M_x[1];
    }
    iVar6 = iVar6 + 1;
  }
  return (__uniq_ptr_data<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>,_true,_true>
          )(__uniq_ptr_data<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>,_true,_true>
            )in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}